

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O3

Proxy * __thiscall Proxy::operator=(Proxy *this,Proxy *param_1)

{
  long lVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  bool bVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x10 < (this->proxy).super_CNetAddr.m_addr._size) {
    free((this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect);
  }
  uVar2 = *(undefined8 *)((long)&(param_1->proxy).super_CNetAddr.m_addr._union + 8);
  (this->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect =
       (param_1->proxy).super_CNetAddr.m_addr._union.indirect_contents.indirect;
  *(undefined8 *)((long)&(this->proxy).super_CNetAddr.m_addr._union + 8) = uVar2;
  (this->proxy).super_CNetAddr.m_addr._size = (param_1->proxy).super_CNetAddr.m_addr._size;
  (param_1->proxy).super_CNetAddr.m_addr._size = 0;
  uVar3 = (param_1->proxy).super_CNetAddr.m_scope_id;
  (this->proxy).super_CNetAddr.m_net = (param_1->proxy).super_CNetAddr.m_net;
  (this->proxy).super_CNetAddr.m_scope_id = uVar3;
  (this->proxy).port = (param_1->proxy).port;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&this->m_unix_socket_path,&param_1->m_unix_socket_path);
  bVar4 = param_1->m_randomize_credentials;
  this->m_is_unix_socket = param_1->m_is_unix_socket;
  this->m_randomize_credentials = bVar4;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

Proxy() : m_is_unix_socket(false), m_randomize_credentials(false) {}